

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O3

void reusable_node_advance(ReusableNode *self)

{
  int32_t *piVar1;
  SubtreePool *pool;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  StackEntry *__ptr;
  TSLanguage *self_00;
  int iVar5;
  StackSliceArray SVar6;
  uint32_t uVar7;
  Subtree *pSVar8;
  int iVar9;
  StackVersion SVar10;
  _Bool _Var11;
  TSStateId state;
  Subtree SVar12;
  StackEntry *pSVar13;
  MutableSubtree left;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  uint extraout_EDX;
  int iVar17;
  uint32_t uVar18;
  ushort state_00;
  StackVersion version1;
  int iVar19;
  ulong uVar20;
  TSSymbol symbol;
  uint uVar21;
  TSParser *pTVar22;
  MutableSubtree MVar23;
  SubtreeHeapData *pSVar24;
  int in_R8D;
  uint in_R9D;
  uint uVar25;
  StackSlice *pSVar26;
  StackSlice *pSVar27;
  int iVar28;
  TSParser *__size;
  bool bVar29;
  byte bVar30;
  StackSliceArray SVar31;
  Length result;
  ulong uStack_148;
  TableEntry TStack_120;
  undefined8 uStack_110;
  StackSlice *pSStack_108;
  SubtreeArray SStack_100;
  undefined8 uStack_f0;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  StackVersion SStack_cc;
  uint uStack_c8;
  int iStack_c4;
  SubtreeArray SStack_c0;
  ulong uStack_a8;
  StackSlice *pSStack_a0;
  ReusableNode *pRStack_98;
  SubtreeHeapData *pSStack_90;
  ulong uStack_88;
  StackEntry *pSStack_80;
  TSParser *pTStack_78;
  code *pcStack_70;
  uint32_t local_64;
  char cStack_60;
  
  bVar30 = 0;
  uVar14 = (self->stack).size;
  if (uVar14 == 0) {
    pcStack_70 = (code *)0x1374d1;
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x31,"void reusable_node_advance(ReusableNode *)");
  }
  __ptr = (self->stack).contents;
  SVar12 = (Subtree)__ptr[uVar14 - 1].tree.ptr;
  if (((ulong)SVar12.ptr & 1) == 0) {
    uVar3 = ((Length *)((long)SVar12 + 4))->bytes;
    uVar4 = ((Length *)((long)SVar12 + 0x10))->bytes;
  }
  else {
    uVar3 = SVar12._2_4_ & 0xff;
    uVar4 = SVar12._3_4_ & 0xff;
  }
  uVar18 = __ptr[uVar14 - 1].byte_offset;
  if ((((ulong)SVar12.ptr & 1) == 0) && (((SVar12.ptr)->field_0x2c & 0x40) != 0)) {
    pcStack_70 = (code *)0x1373ba;
    SVar12 = ts_subtree_last_external_token(SVar12);
    self->last_external_token = SVar12;
  }
  local_64 = uVar18 + uVar3 + uVar4;
  uVar3 = uVar14 * 2;
  uVar14 = uVar14 + 1;
  do {
    uVar18 = uVar14;
    uVar4 = uVar18 - 2;
    uVar15 = (ulong)uVar4;
    (self->stack).size = uVar4;
    if (uVar18 == 2) {
      return;
    }
    if (uVar4 <= uVar18 - 3) {
      pcStack_70 = (code *)0x1374b2;
      __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                    ,0x3d,"void reusable_node_advance(ReusableNode *)");
    }
    pSVar24 = __ptr[uVar18 - 3].tree.ptr;
    uVar4 = 0;
    if (((ulong)pSVar24 & 1) == 0) {
      uVar4 = pSVar24->child_count;
    }
    uVar25 = __ptr[uVar15].child_index + 1;
    uVar14 = uVar18 - 1;
    uVar3 = uVar3 - 2;
  } while (uVar4 <= uVar25);
  pSVar13 = __ptr;
  if (uVar14 - (self->stack).capacity == 1) {
    uVar20 = 8;
    if (8 < uVar3) {
      uVar20 = (ulong)uVar3;
    }
    if (uVar18 - 2 < (uint)uVar20) {
      __size = (TSParser *)(uVar20 << 4);
      pcStack_70 = (code *)0x137447;
      pTVar22 = __size;
      pSVar13 = (StackEntry *)realloc(__ptr,(size_t)__size);
      SStack_cc = (StackVersion)pTVar22;
      if (pSVar13 == (StackEntry *)0x0) {
        pcStack_70 = ts_parser__reduce;
        pTVar22 = __size;
        reusable_node_advance_cold_1();
        uVar3 = (pTVar22->stack->heads).size;
        iStack_c4 = in_R8D;
        pRStack_98 = self;
        pSStack_90 = pSVar24;
        uStack_88 = (ulong)uVar25;
        pSStack_80 = __ptr;
        pTStack_78 = __size;
        pcStack_70 = (code *)uVar20;
        SVar31 = ts_stack_pop_count(pTVar22->stack,SStack_cc,uVar14);
        uVar14 = SVar31.size;
        if (uVar14 != 0) {
          pool = &pTVar22->tree_pool;
          uStack_c8 = in_R9D & 0xffff;
          pSStack_a0 = SVar31.contents + 1;
          uStack_a8 = (ulong)(2 - uVar14);
          iVar19 = 0;
          uStack_148 = 0;
          SVar6 = SVar31;
          do {
            uStack_e0 = SVar6._8_8_;
            pSStack_108 = SVar6.contents;
            pSVar26 = SVar31.contents;
            iVar17 = (int)uStack_148;
            uStack_f0 = *(undefined8 *)&pSVar26[uStack_148].version;
            pSVar27 = pSVar26 + uStack_148;
            SStack_100.contents = (pSVar27->subtrees).contents;
            SStack_100.size = (pSVar27->subtrees).size;
            SStack_100.capacity = (pSVar27->subtrees).capacity;
            uVar25 = (int)uStack_f0 - iVar19;
            uVar4 = SVar31.size;
            if ((iVar17 == 0) || (uVar25 < 0xb)) {
              uVar15 = SStack_100._8_8_ & 0xffffffff;
              SStack_c0.size = 0;
              if (uVar15 != 0) {
                do {
                  uVar20 = uVar15 - 1;
                  pSVar24 = SStack_100.contents[uVar20 & 0xffffffff].ptr;
                  if (((ulong)pSVar24 & 1) == 0) {
                    uVar21 = *(uint *)&pSVar24->field_0x2c >> 2;
                  }
                  else {
                    uVar21 = (uint)((ulong)pSVar24 >> 3) & 0x1fffffff;
                  }
                  if ((uVar21 & 1) == 0) {
                    SStack_c0.size = (uint32_t)uVar15;
                    break;
                  }
                  uVar15 = uVar20;
                } while ((int)uVar20 != 0);
              }
              SStack_c0.capacity = SStack_100.capacity;
              symbol = (TSSymbol)extraout_EDX;
              uStack_d8 = uStack_f0;
              SStack_c0.contents = SStack_100.contents;
              left = ts_subtree_new_node(pool,symbol,&SStack_c0,uStack_c8,pTVar22->language);
              if (iVar17 + 1U < uVar4) {
                uVar15 = (ulong)(iVar17 + 1U);
                do {
                  uVar20 = uVar15;
                  uStack_110 = *(undefined8 *)&pSVar26[uVar20].version;
                  pSVar27 = pSVar26 + uVar20;
                  TStack_120.actions = (TSParseAction *)(pSVar27->subtrees).contents;
                  TStack_120.action_count = (pSVar27->subtrees).size;
                  TStack_120._12_4_ = (pSVar27->subtrees).capacity;
                  if ((int)uStack_110 != (int)uStack_f0) break;
                  uVar15 = TStack_120._8_8_ & 0xffffffff;
                  uVar18 = TStack_120.action_count + 1;
                  do {
                    bVar29 = uVar15 == 0;
                    uVar15 = uVar15 - 1;
                    if (bVar29) {
                      uVar18 = 0;
                      break;
                    }
                    pSVar24 = ((Subtree *)TStack_120.actions)[uVar15].ptr;
                    if (((ulong)pSVar24 & 1) == 0) {
                      uVar21 = *(uint *)&pSVar24->field_0x2c >> 2;
                    }
                    else {
                      uVar21 = (uint)((ulong)pSVar24 >> 3) & 0x1fffffff;
                    }
                    uVar18 = uVar18 - 1;
                  } while ((uVar21 & 1) != 0);
                  MVar23 = left;
                  pSVar24 = (pTVar22->scratch_tree).ptr;
                  for (lVar16 = 0xb; lVar16 != 0; lVar16 = lVar16 + -1) {
                    uVar7 = ((Length *)((long)MVar23 + 4))->bytes;
                    pSVar24->ref_count = *(uint32_t *)MVar23;
                    (pSVar24->padding).bytes = uVar7;
                    MVar23.data = MVar23.data + (ulong)bVar30 * -0x10 + 8;
                    pSVar24 = (SubtreeHeapData *)((long)pSVar24 + (ulong)bVar30 * -0x10 + 8);
                  }
                  ((pTVar22->scratch_tree).ptr)->child_count = 0;
                  ts_subtree_set_children
                            (pTVar22->scratch_tree,(Subtree *)TStack_120.actions,uVar18,
                             pTVar22->language);
                  _Var11 = ts_parser__select_tree
                                     (pTVar22,(Subtree)left,*(Subtree *)&pTVar22->scratch_tree);
                  if (_Var11) {
                    pSVar24 = (pTVar22->scratch_tree).ptr;
                    MVar23 = left;
                    for (lVar16 = 0xb; lVar16 != 0; lVar16 = lVar16 + -1) {
                      uVar18 = (pSVar24->padding).bytes;
                      *(uint32_t *)MVar23 = pSVar24->ref_count;
                      ((Length *)((long)MVar23 + 4))->bytes = uVar18;
                      pSVar24 = (SubtreeHeapData *)((long)pSVar24 + (ulong)bVar30 * -0x10 + 8);
                      MVar23.data = MVar23.data + (ulong)bVar30 * -0x10 + 8;
                    }
                    ts_subtree_array_delete(pool,&SStack_100);
                    uStack_f0 = uStack_110;
                    SStack_100.contents = (Subtree *)TStack_120.actions;
                    SStack_100._8_8_ = TStack_120._8_8_;
                  }
                  else {
                    ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_120);
                  }
                  uVar15 = uVar20 + 1;
                  uStack_148 = uVar20;
                } while ((uint)(uVar20 + 1) != uVar4);
              }
              piVar1 = &((left.ptr)->field_17).field_0.dynamic_precedence;
              *piVar1 = *piVar1 + iStack_c4;
              ((left.ptr)->field_17).field_0.alias_sequence_id = (uint16_t)in_R9D;
              if ((pTVar22->stack->heads).size <= uVar25) {
                __assert_fail("(uint32_t)version < (&self->heads)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
              }
              state_00 = ((pTVar22->stack->heads).contents[uVar25].node)->state;
              if (symbol < 0xfffe) {
                self_00 = pTVar22->language;
                if ((extraout_EDX & 0xffff) < self_00->token_count) {
                  ts_language_table_entry(self_00,state_00,symbol,&TStack_120);
                  if (TStack_120.action_count != 0) {
                    state = *(TSStateId *)(TStack_120.actions + (TStack_120.action_count - 1));
                    bVar2 = *(byte *)((long)TStack_120.actions +
                                     (ulong)(TStack_120.action_count - 1) * 8 + 6);
                    if (((bVar2 & 0xf) == 0) || ((bVar2 & 0xf) == 3)) goto LAB_001378af;
                  }
                  goto LAB_0013785c;
                }
                state = self_00->parse_table
                        [(uint)state_00 * self_00->symbol_count + (extraout_EDX & 0xffff)];
              }
              else {
LAB_0013785c:
                state = 0;
              }
LAB_001378af:
              if (1 < uVar3 || (uVar14 != 1 || cStack_60 != '\0')) {
                (left.ptr)->field_0x2c = (left.ptr)->field_0x2c | 0x18;
                state_00 = TS_TREE_STATE_NONE;
              }
              (left.ptr)->parse_state = state_00;
              ts_stack_push(pTVar22->stack,uVar25,(Subtree)left,false,state);
              pSVar8 = SStack_100.contents;
              uVar4 = (left.ptr)->child_count;
              if (uVar4 < SStack_100.size) {
                iVar17 = SStack_100.size - uVar4;
                lVar16 = 0;
                do {
                  ts_stack_push(pTVar22->stack,uVar25,pSVar8[(ulong)uVar4 + lVar16],false,state);
                  lVar16 = lVar16 + 1;
                } while (iVar17 != (int)lVar16);
              }
              SVar10 = SStack_cc;
              pSVar27 = pSStack_108;
              if ((int)uStack_d8 != iVar19) {
                version1 = 0;
                do {
                  if ((SVar10 != version1) &&
                     (_Var11 = ts_stack_merge(pTVar22->stack,version1,uVar25), _Var11)) {
                    iVar19 = iVar19 + 1;
                    break;
                  }
                  version1 = version1 + 1;
                } while (uVar25 != version1);
              }
              SVar31.size = (undefined4)uStack_e0;
              SVar31.capacity = uStack_e0._4_4_;
              SVar31.contents = pSVar27;
              iVar17 = (int)uStack_148;
            }
            else {
              ts_stack_remove_version(pTVar22->stack,uVar25);
              ts_subtree_array_delete(pool,&SStack_100);
              iVar19 = iVar19 + 1;
              uVar25 = iVar17 + 1;
              if (uVar25 < uVar4) {
                iVar9 = (int)uStack_f0;
                uStack_110 = *(undefined8 *)&pSVar26[uVar25].version;
                pSVar26 = pSVar26 + uVar25;
                TStack_120.actions = (TSParseAction *)(pSVar26->subtrees).contents;
                TStack_120.action_count = (pSVar26->subtrees).size;
                TStack_120._12_4_ = (pSVar26->subtrees).capacity;
                if ((int)uStack_110 == (int)uStack_f0) {
                  uStack_d8 = CONCAT44(uStack_d8._4_4_,uVar25);
                  pSVar27 = pSStack_a0 + uVar25;
                  iVar5 = (int)uStack_a8;
                  iVar28 = 0;
                  do {
                    ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_120);
                    if (iVar5 + iVar17 == iVar28) {
                      iVar17 = (int)uStack_d8 - iVar28;
                      goto LAB_00137977;
                    }
                    uStack_110 = *(undefined8 *)&pSVar27->version;
                    TStack_120.actions = (TSParseAction *)(pSVar27->subtrees).contents;
                    TStack_120.action_count = (pSVar27->subtrees).size;
                    TStack_120._12_4_ = (pSVar27->subtrees).capacity;
                    iVar28 = iVar28 + -1;
                    pSVar27 = pSVar27 + 1;
                  } while ((int)uStack_110 == iVar9);
                  iVar17 = iVar17 - iVar28;
LAB_00137977:
                  SVar31.size = (undefined4)uStack_e0;
                  SVar31.capacity = uStack_e0._4_4_;
                  SVar31.contents = pSStack_108;
                }
              }
            }
            SVar6.size = (undefined4)uStack_e0;
            SVar6.capacity = uStack_e0._4_4_;
            SVar6.contents = pSStack_108;
            uStack_148 = (ulong)(iVar17 + 1U);
          } while (iVar17 + 1U < SVar31.size);
        }
        return;
      }
      (self->stack).contents = pSVar13;
      (self->stack).capacity = (uint)uVar20;
      uVar3 = (self->stack).size;
      uVar15 = (ulong)uVar3;
      uVar14 = uVar3 + 1;
    }
  }
  (self->stack).size = uVar14;
  pSVar13[uVar15].tree = (pSVar24->field_17).field_0.children[uVar25];
  pSVar13[uVar15].child_index = uVar25;
  pSVar13[uVar15].byte_offset = local_64;
  return;
}

Assistant:

static inline void reusable_node_advance(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  uint32_t byte_offset = last_entry.byte_offset + ts_subtree_total_bytes(last_entry.tree);
  if (ts_subtree_has_external_tokens(last_entry.tree)) {
    self->last_external_token = ts_subtree_last_external_token(last_entry.tree);
  }

  Subtree tree;
  uint32_t next_index;
  do {
    StackEntry popped_entry = array_pop(&self->stack);
    next_index = popped_entry.child_index + 1;
    if (self->stack.size == 0) return;
    tree = array_back(&self->stack)->tree;
  } while (ts_subtree_child_count(tree) <= next_index);

  array_push(&self->stack, ((StackEntry) {
    .tree = tree.ptr->children[next_index],
    .child_index = next_index,
    .byte_offset = byte_offset,
  }));
}